

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhSplit(lhpage *pTarget,int *pRetry)

{
  int iVar1;
  int local_4c;
  unqlite_page *puStack_48;
  int rc;
  unqlite_page *pRaw;
  lhpage *pNew;
  lhpage *pOld;
  lhash_bmap_rec *pRec;
  lhash_kv_engine *pEngine;
  int *pRetry_local;
  lhpage *pTarget_local;
  
  pRec = (lhash_bmap_rec *)pTarget->pHash;
  pEngine = (lhash_kv_engine *)pRetry;
  pRetry_local = (int *)pTarget;
  pOld = (lhpage *)lhMapFindBucket((lhash_kv_engine *)pRec,((lhash_kv_engine *)pRec)->split_bucket);
  if (pOld == (lhpage *)0x0) {
    pTarget_local._4_4_ = -0x18;
  }
  else {
    pTarget_local._4_4_ = lhLoadPage((lhash_kv_engine *)pRec,(pgno)pOld->pRaw,(lhpage *)0x0,&pNew,0)
    ;
    if ((pTarget_local._4_4_ == 0) &&
       (pTarget_local._4_4_ = lhAcquirePage((lhash_kv_engine *)pRec,&stack0xffffffffffffffb8),
       pTarget_local._4_4_ == 0)) {
      pRaw = (unqlite_page *)lhNewPage((lhash_kv_engine *)pRec,puStack_48,(lhpage *)0x0);
      if ((lhpage *)pRaw == (lhpage *)0x0) {
        pTarget_local._4_4_ = -1;
      }
      else {
        local_4c = lhSetEmptyPage((lhpage *)pRaw);
        if ((local_4c == 0) &&
           (local_4c = lhMapWriteRecord((lhash_kv_engine *)pRec,pRec[6].iLogic + pRec[6].iReal,
                                        puStack_48->iPage), local_4c == 0)) {
          if (*(pgno *)(*(long *)(pRetry_local + 2) + 0x10) == pNew->pRaw->iPage) {
            *(undefined4 *)&pEngine->pIo = 1;
          }
          local_4c = lhPageSplit(pNew,(lhpage *)pRaw,pRec[6].iLogic,
                                 (pgno)((long)&pRec[6].pNext[-1].pPrevCol + 7));
          if (local_4c == 0) {
            pRec[6].iLogic = pRec[6].iLogic + 1;
            iVar1 = (**(code **)(pRec->iLogic + 0x28))(pRec[4].pNext);
            if (iVar1 != 0) {
              return iVar1;
            }
            if (pRec[6].iLogic < pRec[6].iReal) {
              SyBigEndianPack64((uchar *)((pRec[4].pNext)->iLogic + 0x10),pRec[6].iLogic);
            }
            else {
              pRec[6].iLogic = 0;
              pRec[6].iReal = (pgno)pRec[6].pNext;
              pRec[6].pNext = (lhash_bmap_rec *)((long)pRec[6].pNext << 1);
              if (pRec[6].pNext == (lhash_bmap_rec *)0x0) {
                (**(code **)(pRec->iLogic + 0x80))
                          (*(undefined8 *)pRec->iLogic,
                           "Database page (64-bit integer) limit reached");
                return -7;
              }
              SyBigEndianPack64((uchar *)((pRec[4].pNext)->iLogic + 0x10),pRec[6].iLogic);
              SyBigEndianPack64((uchar *)((pRec[4].pNext)->iLogic + 0x18),pRec[6].iReal);
            }
            return 0;
          }
        }
        (**(code **)(pRec->iLogic + 0x50))(pRaw->pUserData);
        pTarget_local._4_4_ = local_4c;
      }
    }
  }
  return pTarget_local._4_4_;
}

Assistant:

static int lhSplit(lhpage *pTarget,int *pRetry)
{
	lhash_kv_engine *pEngine = pTarget->pHash;
	lhash_bmap_rec *pRec;
	lhpage *pOld,*pNew;
	unqlite_page *pRaw;
	int rc;
	/* Get the real page number of the bucket to split */
	pRec = lhMapFindBucket(pEngine,pEngine->split_bucket);
	if( pRec == 0 ){
		/* Can't happen */
		return UNQLITE_CORRUPT;
	}
	/* Load the page to be split */
	rc = lhLoadPage(pEngine,pRec->iReal,0,&pOld,0);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Request a new page */
	rc = lhAcquirePage(pEngine,&pRaw);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Initialize the page */
	pNew = lhNewPage(pEngine,pRaw,0);
	if( pNew == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Mark as an empty page */
	rc = lhSetEmptyPage(pNew);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Install and write the logical map record */
	rc = lhMapWriteRecord(pEngine,
		pEngine->split_bucket + pEngine->max_split_bucket,
		pRaw->iPage
		);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	if( pTarget->pRaw->iPage == pOld->pRaw->iPage ){
		*pRetry = 1;
	}
	/* Perform the split */
	rc = lhPageSplit(pOld,pNew,pEngine->split_bucket,pEngine->nmax_split_nucket - 1);
	if( rc != UNQLITE_OK ){
		goto fail;
	}
	/* Update the database header */
	pEngine->split_bucket++;
	/* Acquire a writer lock on the first page */
	rc = pEngine->pIo->xWrite(pEngine->pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pEngine->split_bucket >= pEngine->max_split_bucket ){
		/* Increment the generation number */
		pEngine->split_bucket = 0;
		pEngine->max_split_bucket = pEngine->nmax_split_nucket;
		pEngine->nmax_split_nucket <<= 1;
		if( !pEngine->nmax_split_nucket ){
			/* If this happen to your installation, please tell us <chm@symisc.net> */
			pEngine->pIo->xErr(pEngine->pIo->pHandle,"Database page (64-bit integer) limit reached");
			return UNQLITE_LIMIT;
		}
		/* Reflect in the page header */
		SyBigEndianPack64(&pEngine->pHeader->zData[4/*Magic*/+4/*Hash*/+8/*Free list*/],pEngine->split_bucket);
		SyBigEndianPack64(&pEngine->pHeader->zData[4/*Magic*/+4/*Hash*/+8/*Free list*/+8/*Split bucket*/],pEngine->max_split_bucket);
	}else{
		/* Modify only the split bucket */
		SyBigEndianPack64(&pEngine->pHeader->zData[4/*Magic*/+4/*Hash*/+8/*Free list*/],pEngine->split_bucket);
	}
	/* All done */
	return UNQLITE_OK;
fail:
	pEngine->pIo->xPageUnref(pNew->pRaw);
	return rc;
}